

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.cpp
# Opt level: O2

void __thiscall
Nova::Grid_Iterator_Cell<float,_1>::Grid_Iterator_Cell
          (Grid_Iterator_Cell<float,_1> *this,Grid<float,_1> *grid_input,int number_of_ghost_cells,
          T_Region *region_type,int side)

{
  T_STORAGE TVar1;
  T_Region TVar2;
  int iVar3;
  uint __line;
  char *__assertion;
  T_INDEX max_copy;
  Range<int,_1> domain;
  
  Grid_Iterator<float,_1>::Grid_Iterator(&this->super_Grid_Iterator<float,_1>,grid_input);
  if (2 < (uint)side) {
    __assertion = "side>=0 && side<=2*d";
    __line = 0xe;
LAB_00129933:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,__line,
                  "Nova::Grid_Iterator_Cell<float, 1>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 1]"
                 );
  }
  TVar2 = *region_type;
  if ((TVar2 & ~Ghost_Region) == Boundary_Region) {
    __assertion = 
    "(region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region)";
    __line = 0xf;
    goto LAB_00129933;
  }
  iVar3 = (((this->super_Grid_Iterator<float,_1>).grid)->counts)._data._M_elems[0];
  domain.min_corner._data._M_elems[0] = (T_STORAGE)(1 - number_of_ghost_cells);
  TVar1._M_elems[0] = (_Type)(iVar3 + number_of_ghost_cells);
  domain.max_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)TVar1._M_elems[0];
  if (TVar2 == Boundary_Interior_Region) {
    domain.max_corner._data._M_elems[0] = domain.min_corner._data._M_elems[0];
    if (side == 0) {
      Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain);
      domain.min_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)TVar1._M_elems[0];
      domain.max_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)TVar1._M_elems[0];
      Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain);
      domain.max_corner._data._M_elems[0] = (T_STORAGE)((int)TVar1._M_elems[0] + -1);
      domain.min_corner._data._M_elems[0] = (T_STORAGE)(2 - number_of_ghost_cells);
      goto LAB_001298d3;
    }
    if ((side & 1U) == 0) {
      domain.min_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)TVar1._M_elems[0];
      domain.max_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)TVar1._M_elems[0];
    }
  }
  else if (TVar2 == Whole_Region) {
    if (side != 0) {
      __assertion = "!side";
      __line = 0x14;
      goto LAB_00129933;
    }
  }
  else {
    if ((number_of_ghost_cells < 1) || (TVar2 != Ghost_Region)) {
      __assertion = "(region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0)";
      __line = 0x2e;
      goto LAB_00129933;
    }
    if (side == 0) {
      domain.max_corner._data._M_elems[0] = (T_STORAGE)(_Type)0x0;
      Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain);
      domain.min_corner._data._M_elems[0] =
           (T_STORAGE)((((this->super_Grid_Iterator<float,_1>).grid)->counts)._data._M_elems[0] + 1)
      ;
      domain.max_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)TVar1._M_elems[0];
      Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain);
      domain.max_corner._data._M_elems[0] =
           (T_STORAGE)(((this->super_Grid_Iterator<float,_1>).grid)->counts)._data._M_elems[0];
      domain.min_corner._data._M_elems[0] = (T_STORAGE)(_Type)0x1;
      goto LAB_001298d3;
    }
    if ((side & 1U) == 0) {
      domain.min_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)(iVar3 + 1);
    }
    else {
      domain.max_corner._data._M_elems[0] = (T_STORAGE)(_Type)0x0;
    }
  }
  Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain);
LAB_001298d3:
  Grid_Iterator<float,_1>::Reset(&this->super_Grid_Iterator<float,_1>,0);
  return;
}

Assistant:

Grid_Iterator_Cell<T,d>::
Grid_Iterator_Cell(const Grid<T,d>& grid_input,const int number_of_ghost_cells,const T_Region& region_type,const int side)
    :Base(grid_input)
{
    assert(side>=0 && side<=2*d);
    assert((region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region));
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:               assert(!side);
                                                    Add_Region(domain);
                                                    break;

        case Grid<T,d>::Boundary_Interior_Region:   if(!side)
                                                    {
                                                        Range<int,d> domain_copy(domain);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=domain.min_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain.min_corner(axis)=domain_copy.max_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain_copy.max_corner(axis)-1;
                                                            domain.min_corner(axis)=domain_copy.min_corner(axis)+1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=domain.min_corner(axis);
                                                        else domain.min_corner(axis)=domain.max_corner(axis);
                                                        Add_Region(domain);
                                                    }
                                                    break;

        default:                                    assert((region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0));
                                                    if(!side)
                                                    {
                                                        T_INDEX max_copy(domain.max_corner);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=0;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=max_copy(axis);
                                                            domain.min_corner(axis)=grid.counts(axis)+1;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=grid.counts(axis);
                                                            domain.min_corner(axis)=1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=0;
                                                        else domain.min_corner(axis)=grid.counts(axis)+1;
                                                        Add_Region(domain);
                                                    }
                                                    break;
    }
    Reset();
}